

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool operator!=(ON_SurfaceDraftAngleColorMapping *lhs,ON_SurfaceDraftAngleColorMapping *rhs)

{
  bool bVar1;
  ON_Interval OVar2;
  ON_Interval OVar3;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  ON_3dVector up [2];
  ON_SurfaceDraftAngleColorMapping *rhs_local;
  ON_SurfaceDraftAngleColorMapping *lhs_local;
  
  ON_SurfaceDraftAngleColorMapping::Up((ON_3dVector *)local_58,lhs);
  ON_SurfaceDraftAngleColorMapping::Up((ON_3dVector *)&up[0].z,rhs);
  bVar1 = ON_3dVector::operator!=((ON_3dVector *)local_58,(ON_3dVector *)&up[0].z);
  if (bVar1) {
    OVar2 = ON_SurfaceDraftAngleColorMapping::AngleRangeInRadians(lhs);
    OVar3 = ON_SurfaceDraftAngleColorMapping::AngleRangeInRadians(rhs);
    local_78 = OVar2.m_t[0];
    local_68 = OVar3.m_t[0];
    local_70 = OVar2.m_t[1];
    local_60 = OVar3.m_t[1];
    if ((((local_78 != local_68) || (NAN(local_78) || NAN(local_68))) || (local_70 != local_60)) ||
       (NAN(local_70) || NAN(local_60))) {
      OVar2 = ON_SurfaceDraftAngleColorMapping::HueRangeInRadians(lhs);
      OVar3 = ON_SurfaceDraftAngleColorMapping::HueRangeInRadians(rhs);
      local_98 = OVar2.m_t[0];
      local_88 = OVar3.m_t[0];
      local_90 = OVar2.m_t[1];
      local_80 = OVar3.m_t[1];
      if (((local_98 != local_88) || (NAN(local_98) || NAN(local_88))) ||
         ((local_90 != local_80 || (NAN(local_90) || NAN(local_80))))) {
        if (((NAN(local_78)) || (NAN(local_70))) || ((NAN(local_68) || (NAN(local_60))))) {
          return false;
        }
        if ((((!NAN(local_98)) && (!NAN(local_90))) && (!NAN(local_88))) && (!NAN(local_80))) {
          return true;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool operator!=(const ON_SurfaceDraftAngleColorMapping& lhs, const ON_SurfaceDraftAngleColorMapping& rhs)
{
  // if any double is a nan, this compare must be false.
  const ON_3dVector up[2] = { lhs.Up(), rhs.Up() };
  if (up[0] != up[1])
  {
    const ON_Interval ar[2] = { lhs.AngleRangeInRadians() ,rhs.AngleRangeInRadians() };
    if (ar[0].m_t[0] != ar[1].m_t[0] || ar[0].m_t[1] != ar[1].m_t[1])
    {
      const ON_Interval hr[2] = { lhs.HueRangeInRadians() ,rhs.HueRangeInRadians() };
      if (hr[0].m_t[0] != hr[1].m_t[0] || hr[0].m_t[1] != hr[1].m_t[1])
      {
        // any compare involving nans is false
        if (ON_IS_NAN(ar[0].m_t[0]) || ON_IS_NAN(ar[0].m_t[1]) || ON_IS_NAN(ar[1].m_t[0]) || ON_IS_NAN(ar[1].m_t[1]))
          return false;
        if (ON_IS_NAN(hr[0].m_t[0]) || ON_IS_NAN(hr[0].m_t[1]) || ON_IS_NAN(hr[1].m_t[0]) || ON_IS_NAN(hr[1].m_t[1]))
          return false;

        return true;
      }
    }
  }
  return false;
}